

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O2

void BrotliCompressFragmentTwoPass
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t table_size,size_t *storage_ix,uint8_t *storage
               )

{
  int iVar1;
  
  iVar1 = 0x1f;
  if ((uint)table_size != 0) {
    for (; (uint)table_size >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  switch(iVar1) {
  case 8:
    BrotliCompressFragmentTwoPassImpl8
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 9:
    BrotliCompressFragmentTwoPassImpl9
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 10:
    BrotliCompressFragmentTwoPassImpl10
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 0xb:
    BrotliCompressFragmentTwoPassImpl11
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 0xc:
    BrotliCompressFragmentTwoPassImpl12
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 0xd:
    BrotliCompressFragmentTwoPassImpl13
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 0xe:
    BrotliCompressFragmentTwoPassImpl14
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 0xf:
    BrotliCompressFragmentTwoPassImpl15
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 0x10:
    BrotliCompressFragmentTwoPassImpl16
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  case 0x11:
    BrotliCompressFragmentTwoPassImpl17
              (m,input,input_size,is_last,command_buf,literal_buf,table,storage_ix,storage);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                  ,0x248,
                  "void BrotliCompressFragmentTwoPass(MemoryManager *, const uint8_t *, size_t, int, uint32_t *, uint8_t *, int *, size_t, size_t *, uint8_t *)"
                 );
  }
  return;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}